

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-death-test.cc
# Opt level: O0

bool __thiscall
testing::internal::DefaultDeathTestFactory::Create
          (DefaultDeathTestFactory *this,char *statement,
          Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
          *matcher,char *file,int line,DeathTest **test)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  void *pvVar4;
  char *in_RCX;
  int __c;
  int __c_00;
  int __c_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDX;
  char *in_RSI;
  string *__s;
  int in_R8D;
  undefined8 *in_R9;
  int death_test_index;
  InternalRunDeathTestFlag *flag;
  UnitTestImpl *impl;
  Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  *in_stack_fffffffffffffe08;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe18;
  undefined4 in_stack_fffffffffffffe38;
  undefined4 in_stack_fffffffffffffe3c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  undefined4 in_stack_fffffffffffffe48;
  char *in_stack_fffffffffffffe58;
  NoExecDeathTest *in_stack_fffffffffffffe60;
  char *in_stack_fffffffffffffe68;
  ExecDeathTest *in_stack_fffffffffffffe70;
  string local_188 [39];
  undefined1 local_161;
  undefined1 local_141;
  undefined4 local_124;
  string local_120 [48];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  string local_d0 [32];
  string local_b0 [32];
  string local_90 [32];
  string local_70 [36];
  int local_4c;
  InternalRunDeathTestFlag *local_48;
  UnitTestImpl *local_40;
  undefined8 *local_38;
  int local_2c;
  char *local_28;
  
  local_38 = in_R9;
  local_2c = in_R8D;
  local_28 = in_RCX;
  local_40 = GetUnitTestImpl();
  local_48 = UnitTestImpl::internal_run_death_test_flag((UnitTestImpl *)0x13f736);
  UnitTestImpl::current_test_info(local_40);
  iVar2 = TestInfo::increment_death_test_count((TestInfo *)0x13f753);
  local_4c = iVar2;
  if (local_48 != (InternalRunDeathTestFlag *)0x0) {
    pcVar3 = InternalRunDeathTestFlag::index(local_48,in_RSI,__c);
    if ((int)pcVar3 < iVar2) {
      __rhs = &local_f0;
      StreamableToString<int>((int *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
      std::operator+((char *)in_stack_fffffffffffffe18,in_stack_fffffffffffffe10);
      __s = local_d0;
      std::operator+(in_stack_fffffffffffffe18,(char *)in_stack_fffffffffffffe10);
      pcVar3 = InternalRunDeathTestFlag::index(local_48,(char *)__s,__c_00);
      local_124 = SUB84(pcVar3,0);
      StreamableToString<int>((int *)CONCAT44(local_124,in_stack_fffffffffffffe38));
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(iVar2,in_stack_fffffffffffffe48),__rhs);
      std::operator+(in_stack_fffffffffffffe18,(char *)in_stack_fffffffffffffe10);
      DeathTest::set_last_death_test_message((string *)0x13f861);
      std::__cxx11::string::~string(local_70);
      std::__cxx11::string::~string(local_90);
      std::__cxx11::string::~string(local_120);
      std::__cxx11::string::~string(local_b0);
      std::__cxx11::string::~string(local_d0);
      std::__cxx11::string::~string((string *)&local_f0);
      return false;
    }
    InternalRunDeathTestFlag::file_abi_cxx11_(local_48);
    bVar1 = std::operator==(in_stack_fffffffffffffe10,(char *)in_stack_fffffffffffffe08);
    if (((!bVar1) || (iVar2 = InternalRunDeathTestFlag::line(local_48), iVar2 != local_2c)) ||
       (pcVar3 = InternalRunDeathTestFlag::index(local_48,local_28,__c_01), (int)pcVar3 != local_4c)
       ) {
      *local_38 = 0;
      return true;
    }
  }
  bVar1 = std::operator==(in_stack_fffffffffffffe10,(char *)in_stack_fffffffffffffe08);
  if (bVar1) {
    pvVar4 = operator_new(0x50);
    iVar2 = (int)((ulong)in_RDX >> 0x20);
    local_141 = 1;
    Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::Matcher((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
               *)in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
    ExecDeathTest::ExecDeathTest
              (in_stack_fffffffffffffe70,in_stack_fffffffffffffe68,
               (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,iVar2);
    local_141 = 0;
    *local_38 = pvVar4;
    Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~Matcher((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)0x13faa8);
  }
  else {
    bVar1 = std::operator==(in_stack_fffffffffffffe10,(char *)in_stack_fffffffffffffe08);
    if (!bVar1) {
      pcVar3 = &stack0xfffffffffffffe58;
      std::operator+(in_stack_fffffffffffffe58,in_RDX);
      std::operator+(in_stack_fffffffffffffe18,pcVar3);
      DeathTest::set_last_death_test_message((string *)0x13fc31);
      std::__cxx11::string::~string(local_188);
      std::__cxx11::string::~string((string *)&stack0xfffffffffffffe58);
      return false;
    }
    pvVar4 = operator_new(0x40);
    local_161 = 1;
    Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::Matcher((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
               *)in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
    NoExecDeathTest::NoExecDeathTest
              (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,
               (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)in_RDX);
    local_161 = 0;
    *local_38 = pvVar4;
    Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~Matcher((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)0x13fb96);
  }
  return true;
}

Assistant:

bool DefaultDeathTestFactory::Create(const char* statement,
                                     Matcher<const std::string&> matcher,
                                     const char* file, int line,
                                     DeathTest** test) {
  UnitTestImpl* const impl = GetUnitTestImpl();
  const InternalRunDeathTestFlag* const flag =
      impl->internal_run_death_test_flag();
  const int death_test_index = impl->current_test_info()
      ->increment_death_test_count();

  if (flag != nullptr) {
    if (death_test_index > flag->index()) {
      DeathTest::set_last_death_test_message(
          "Death test count (" + StreamableToString(death_test_index)
          + ") somehow exceeded expected maximum ("
          + StreamableToString(flag->index()) + ")");
      return false;
    }

    if (!(flag->file() == file && flag->line() == line &&
          flag->index() == death_test_index)) {
      *test = nullptr;
      return true;
    }
  }

# if GTEST_OS_WINDOWS

  if (GTEST_FLAG(death_test_style) == "threadsafe" ||
      GTEST_FLAG(death_test_style) == "fast") {
    *test = new WindowsDeathTest(statement, std::move(matcher), file, line);
  }

# elif GTEST_OS_FUCHSIA

  if (GTEST_FLAG(death_test_style) == "threadsafe" ||
      GTEST_FLAG(death_test_style) == "fast") {
    *test = new FuchsiaDeathTest(statement, std::move(matcher), file, line);
  }

# else

  if (GTEST_FLAG(death_test_style) == "threadsafe") {
    *test = new ExecDeathTest(statement, std::move(matcher), file, line);
  } else if (GTEST_FLAG(death_test_style) == "fast") {
    *test = new NoExecDeathTest(statement, std::move(matcher));
  }

# endif  // GTEST_OS_WINDOWS

  else {  // NOLINT - this is more readable than unbalanced brackets inside #if.
    DeathTest::set_last_death_test_message(
        "Unknown death test style \"" + GTEST_FLAG(death_test_style)
        + "\" encountered");
    return false;
  }